

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t tinfl_decompress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  tinfl_status tVar1;
  size_t in_RSI;
  tinfl_status status;
  tinfl_decompressor decomp;
  size_t local_2b30;
  size_t *in_stack_ffffffffffffd730;
  mz_uint8 *in_stack_ffffffffffffd738;
  mz_uint8 *in_stack_ffffffffffffd740;
  size_t *in_stack_ffffffffffffd748;
  mz_uint8 *in_stack_ffffffffffffd750;
  tinfl_decompressor *in_stack_ffffffffffffd758;
  mz_uint32 in_stack_ffffffffffffd770;
  
  tVar1 = tinfl_decompress(in_stack_ffffffffffffd758,in_stack_ffffffffffffd750,
                           in_stack_ffffffffffffd748,in_stack_ffffffffffffd740,
                           in_stack_ffffffffffffd738,in_stack_ffffffffffffd730,
                           in_stack_ffffffffffffd770);
  local_2b30 = in_RSI;
  if (tVar1 != TINFL_STATUS_DONE) {
    local_2b30 = 0xffffffffffffffff;
  }
  return local_2b30;
}

Assistant:

size_t tinfl_decompress_mem_to_mem(void *pOut_buf, size_t out_buf_len,
                                   const void *pSrc_buf, size_t src_buf_len,
                                   int flags) {
  tinfl_decompressor decomp;
  tinfl_status status;
  tinfl_init(&decomp);
  status =
      tinfl_decompress(&decomp, (const mz_uint8 *)pSrc_buf, &src_buf_len,
                       (mz_uint8 *)pOut_buf, (mz_uint8 *)pOut_buf, &out_buf_len,
                       (flags & ~TINFL_FLAG_HAS_MORE_INPUT) |
                           TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
  return (status != TINFL_STATUS_DONE) ? TINFL_DECOMPRESS_MEM_TO_MEM_FAILED
                                       : out_buf_len;
}